

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

ssize_t __thiscall
zmq::detail::socket_base::recv(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  zmq_msg_t *pzVar2;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  int nbytes;
  unsigned_long *in_stack_ffffffffffffffa8;
  optional<unsigned_long> *in_stack_ffffffffffffffb0;
  error_t *in_stack_ffffffffffffffc0;
  ssize_t local_10;
  
  pzVar2 = message_t::handle((message_t *)CONCAT44(in_register_00000034,__fd));
  iVar1 = zmq_msg_recv(pzVar2,this->_handle,(ulong)__buf & 0xffffffff);
  if (iVar1 < 0) {
    iVar1 = zmq_errno();
    if (iVar1 != 0xb) {
      uVar3 = __cxa_allocate_exception(0x10);
      error_t::error_t(in_stack_ffffffffffffffc0);
      __cxa_throw(uVar3,&error_t::typeinfo,error_t::~error_t);
    }
    CLI::std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x1ff9c4);
  }
  else {
    CLI::std::optional<unsigned_long>::optional<unsigned_long,_true>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_10;
}

Assistant:

detail::recv_result_t recv(message_t &msg, recv_flags flags = recv_flags::none)
    {
        const int nbytes = zmq_msg_recv(msg.handle(), _handle, static_cast<int>(flags));
        if (nbytes >= 0) {
            assert(msg.size() == static_cast<size_t>(nbytes));
            return static_cast<size_t>(nbytes);
        }
        if (zmq_errno() == EAGAIN)
            return {};
        throw error_t();
    }